

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

bool __thiscall FMultiBlockLinesIterator::GoUp(FMultiBlockLinesIterator *this,double x,double y)

{
  bool bVar1;
  int group;
  double y_local;
  double x_local;
  FMultiBlockLinesIterator *this_local;
  
  if ((this->continueup & 1U) != 0) {
    bVar1 = sector_t::PortalBlocksMovement(this->cursector,1);
    if (!bVar1) {
      group = sector_t::GetOppositePortalGroup(this->cursector,1);
      startIteratorForGroup(this,group);
      this->portalflags = 0x20;
      return true;
    }
    this->continueup = false;
  }
  return false;
}

Assistant:

bool FMultiBlockLinesIterator::GoUp(double x, double y)
{
	if (continueup)
	{
		if (!cursector->PortalBlocksMovement(sector_t::ceiling))
		{
			startIteratorForGroup(cursector->GetOppositePortalGroup(sector_t::ceiling));
			portalflags = FFCF_NOFLOOR;
			return true;
		}
		else continueup = false;
	}
	return false;
}